

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_function.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformFuncCall(Transformer *this,PGFuncCall *root)

{
  int iVar1;
  long lVar2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var3;
  PGList *pPVar4;
  char *window_name;
  optional_ptr<duckdb_libpgquery::PGWindowDef,_true> oVar5;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> uVar6;
  _Alloc_hider _Var7;
  bool bVar8;
  ExpressionType EVar9;
  char cVar10;
  Transformer *this_00;
  type pPVar11;
  pointer pWVar12;
  pointer pOVar13;
  PGWindowDef *pPVar14;
  iterator iVar15;
  reference pvVar16;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> *p_Var17
  ;
  type pWVar18;
  pointer pCVar19;
  pointer pOVar20;
  reference __b;
  type expr;
  reference pvVar21;
  ParserException *pPVar22;
  InternalException *pIVar23;
  uint uVar24;
  ExpressionType type;
  long in_RDX;
  optional_ptr<duckdb_libpgquery::PGWindowDef,_true> window_ref;
  CaseCheck check;
  optional_ptr<duckdb_libpgquery::PGWindowDef,_true> window_spec;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children;
  ExpressionType win_fun_type;
  undefined7 uStack_167;
  string local_160;
  bool local_139;
  string lowercase_name;
  pointer local_118;
  string schema;
  string catalog;
  string function_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar2 = *(long *)(in_RDX + 8);
  catalog._M_dataplus._M_p = (pointer)&catalog.field_2;
  catalog._M_string_length = 0;
  catalog.field_2._M_local_buf[0] = '\0';
  schema._M_dataplus._M_p = (pointer)&schema.field_2;
  schema._M_string_length = 0;
  function_name._M_dataplus._M_p = (pointer)&function_name.field_2;
  function_name._M_string_length = 0;
  schema.field_2._M_local_buf[0] = '\0';
  function_name.field_2._M_local_buf[0] = '\0';
  iVar1 = *(int *)(lVar2 + 4);
  if (iVar1 == 1) {
    ::std::__cxx11::string::assign((char *)&catalog);
    ::std::__cxx11::string::assign((char *)&schema);
    check.when_expr.
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> *)
          &(*(__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
              **)(lVar2 + 8))->
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ;
    optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->
              ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&check);
    ::std::__cxx11::string::assign((char *)&function_name);
  }
  else if (iVar1 == 2) {
    ::std::__cxx11::string::assign((char *)&catalog);
    check.when_expr.
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> *)
          &(*(__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
              **)(lVar2 + 8))->
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ;
    optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->
              ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&check);
    ::std::__cxx11::string::assign((char *)&schema);
    check.when_expr.
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> *)
          &(*(__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
              **)(*(long *)(lVar2 + 8) + 8))->
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ;
    optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->
              ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&check);
    ::std::__cxx11::string::assign((char *)&function_name);
  }
  else {
    if (iVar1 != 3) {
      pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&check,"TransformFuncCall - Expected 1, 2 or 3 qualifications",
                 (allocator *)&local_160);
      ParserException::ParserException(pPVar22,(string *)&check);
      __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    check.when_expr.
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> *)
          &(*(__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
              **)(lVar2 + 8))->
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ;
    optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->
              ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&check);
    ::std::__cxx11::string::assign((char *)&catalog);
    check.when_expr.
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> *)
          &(*(__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
              **)(*(long *)(lVar2 + 8) + 8))->
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ;
    optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->
              ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&check);
    ::std::__cxx11::string::assign((char *)&schema);
    check.when_expr.
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> *)
          &(*(__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
              **)(*(long *)(*(long *)(lVar2 + 8) + 8) + 8))->
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ;
    optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->
              ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&check);
    ::std::__cxx11::string::assign((char *)&function_name);
  }
  children.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  children.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  children.
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((*(PGList **)(in_RDX + 0x10) != (PGList *)0x0) &&
     (TransformExpressionList((Transformer *)root,*(PGList **)(in_RDX + 0x10),&children),
     (long)children.
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish -
     (long)children.
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start == 8)) {
    this_00 = (Transformer *)
              vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::get<true>(&children,0);
    pPVar11 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)this_00);
    bVar8 = ExpressionIsEmptyStar(this_00,pPVar11);
    if ((bVar8) && ((*(char *)(in_RDX + 0x2b) == '\0' && (*(long *)(in_RDX + 0x18) == 0)))) {
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::clear(&children.
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             );
    }
  }
  StringUtil::Lower(&lowercase_name,&function_name);
  if (*(long *)(in_RDX + 0x38) != 0) {
    bVar8 = InWindowDefinition((Transformer *)root);
    if (bVar8) {
      pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&check,"window functions are not allowed in window definitions",
                 (allocator *)&local_160);
      ParserException::ParserException(pPVar22,(string *)&check);
      __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    EVar9 = WindowExpression::WindowToExpressionType(&lowercase_name);
    win_fun_type = EVar9;
    if (EVar9 != WINDOW_AGGREGATE) {
      if (EVar9 == INVALID) {
        pIVar23 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&check,"Unknown/unsupported window function",(allocator *)&local_160);
        InternalException::InternalException(pIVar23,(string *)&check);
        __cxa_throw(pIVar23,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (*(char *)(in_RDX + 0x2b) == '\x01') {
        pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&check,
                   "DISTINCT is not implemented for non-aggregate window functions!",
                   (allocator *)&local_160);
        ParserException::ParserException(pPVar22,(string *)&check);
        __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    if (*(long *)(in_RDX + 0x18) != 0) {
      uVar24 = EVar9 - 0x6e;
      if (0x18 < uVar24) {
LAB_00a6d2ad:
        pIVar23 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&check,"Unknown orderable window type %s",(allocator *)&window_spec);
        ExpressionTypeToString_abi_cxx11_(&local_160,(duckdb *)(ulong)EVar9,type);
        InternalException::InternalException<char_const*>
                  (pIVar23,(string *)&check,local_160._M_dataplus._M_p);
        __cxa_throw(pIVar23,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((0x1f0f401U >> (uVar24 & 0x1f) & 1) == 0) {
        if (uVar24 == 0xb) {
          pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&check,"ORDER BY is not supported for the window function \"%s\"",
                     (allocator *)&local_160);
          ParserException::ParserException<char_const*>
                    (pPVar22,(string *)&check,lowercase_name._M_dataplus._M_p);
          __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        goto LAB_00a6d2ad;
      }
    }
    if ((EVar9 != WINDOW_AGGREGATE) && (*(long *)(in_RDX + 0x20) != 0)) {
      pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&check,"FILTER is not implemented for non-aggregate window functions!",
                 (allocator *)&local_160);
      ParserException::ParserException(pPVar22,(string *)&check);
      __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (*(char *)(in_RDX + 0x28) == '\x01') {
      pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&check,"EXPORT_STATE is not supported for window functions!",
                 (allocator *)&local_160);
      ParserException::ParserException(pPVar22,(string *)&check);
      __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((EVar9 == WINDOW_AGGREGATE) && (*(int *)(in_RDX + 0x2c) != 0)) {
      pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&check,"RESPECT/IGNORE NULLS is not supported for windowed aggregates",
                 (allocator *)&local_160);
      ParserException::ParserException(pPVar22,(string *)&check);
      __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    make_uniq<duckdb::WindowExpression,duckdb::ExpressionType_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&>
              ((duckdb *)&local_160,&win_fun_type,&catalog,&schema,&lowercase_name);
    iVar1 = *(int *)(in_RDX + 0x2c);
    pWVar12 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
              ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                            *)&local_160);
    pWVar12->ignore_nulls = iVar1 == 2;
    bVar8 = *(bool *)(in_RDX + 0x2b);
    pWVar12 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
              ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                            *)&local_160);
    pWVar12->distinct = bVar8;
    if (*(long *)(in_RDX + 0x20) != 0) {
      TransformExpression((Transformer *)&check,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root)
      ;
      pWVar12 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                              *)&local_160);
      uVar6 = check.when_expr;
      check.when_expr.
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
            )0x0;
      _Var3._M_head_impl =
           (pWVar12->filter_expr).
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (pWVar12->filter_expr).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (ParsedExpression *)
           uVar6.
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      if ((_Var3._M_head_impl != (ParsedExpression *)0x0) &&
         ((**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))(),
         check.when_expr.
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
         (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
          )0x0)) {
        (**(code **)(*(long *)check.when_expr.
                              super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                              .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl
                    + 8))();
      }
    }
    if (*(long *)(in_RDX + 0x18) != 0) {
      make_uniq<duckdb::OrderModifier>();
      pPVar4 = *(PGList **)(in_RDX + 0x18);
      pOVar13 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                ::operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                              *)&check);
      TransformOrderBy((Transformer *)root,pPVar4,&pOVar13->orders);
      unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
      operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                  *)&check);
      pWVar12 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                              *)&local_160);
      ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::_M_move_assign
                (&(pWVar12->arg_orders).
                  super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>);
      if (check.when_expr.
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)check.when_expr.
                              super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                              .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl
                    + 8))();
      }
    }
    if (win_fun_type == WINDOW_AGGREGATE) {
      pWVar12 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                              *)&local_160);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::_M_move_assign(&(pWVar12->children).
                        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ,&children);
    }
    else {
      if (children.
          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          children.
          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pWVar12 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                  ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                                *)&local_160);
        pvVar16 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::get<true>(&children,0);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&pWVar12->children,pvVar16);
      }
      if ((win_fun_type & 0xfe) == WINDOW_LEAD) {
        if (8 < (ulong)((long)children.
                              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)children.
                             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)) {
          p_Var17 = (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     *)vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                       ::get<true>(&children,1);
          pWVar12 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                    ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                                  *)&local_160);
          ::std::
          __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ::operator=((__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                       *)&pWVar12->offset_expr,p_Var17);
          if (0x10 < (ulong)((long)children.
                                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)children.
                                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                  .
                                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)) {
            p_Var17 = (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                       *)vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                         ::get<true>(&children,2);
            pWVar12 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                      ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                                    *)&local_160);
            ::std::
            __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ::operator=((__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                         *)&pWVar12->default_expr,p_Var17);
            if (0x18 < (ulong)((long)children.
                                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)children.
                                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)) {
              pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&check,"Incorrect number of parameters for function %s",
                         (allocator *)&window_spec);
              ::std::__cxx11::string::string((string *)&local_50,(string *)&lowercase_name);
              ParserException::ParserException<std::__cxx11::string>
                        (pPVar22,(string *)&check,&local_50);
              __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
            }
          }
        }
      }
      else if (win_fun_type == WINDOW_NTH_VALUE) {
        if (8 < (ulong)((long)children.
                              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)children.
                             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)) {
          pWVar12 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                    ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                                  *)&local_160);
          pvVar16 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    ::get<true>(&children,1);
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)&pWVar12->children,pvVar16);
          if (0x10 < (ulong)((long)children.
                                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)children.
                                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                  .
                                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)) {
            pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&check,"Incorrect number of parameters for function %s",
                       (allocator *)&window_spec);
            ::std::__cxx11::string::string((string *)&local_70,(string *)&lowercase_name);
            ParserException::ParserException<std::__cxx11::string>
                      (pPVar22,(string *)&check,&local_70);
            __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
      }
      else if (8 < (ulong)((long)children.
                                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)children.
                                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                .
                                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
        pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&check,"Incorrect number of parameters for function %s",
                   (allocator *)&window_spec);
        ::std::__cxx11::string::string((string *)&local_90,(string *)&lowercase_name);
        ParserException::ParserException<std::__cxx11::string>(pPVar22,(string *)&check,&local_90);
        __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    window_spec.ptr = *(PGWindowDef **)(in_RDX + 0x38);
    pPVar14 = optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::operator->(&window_spec);
    if (pPVar14->name != (char *)0x0) {
      pPVar14 = optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::operator->(&window_spec);
      ::std::__cxx11::string::string((string *)&check,pPVar14->name,(allocator *)&window_ref);
      iVar15 = ::std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&root[1].args,(key_type *)&check);
      ::std::__cxx11::string::~string((string *)&check);
      if (iVar15.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_true>
          ._M_cur == (__node_type *)0x0) {
        pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&check,"window \"%s\" does not exist",(allocator *)&window_ref);
        pPVar14 = optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::operator->(&window_spec);
        ParserException::ParserException<char*>(pPVar22,(string *)&check,pPVar14->name);
        __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      window_spec.ptr =
           *(PGWindowDef **)
            ((long)iVar15.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_true>
                   ._M_cur + 0x28);
    }
    window_ref.ptr = window_spec.ptr;
    pPVar14 = optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::operator->(&window_ref);
    window_name = pPVar14->refname;
    pPVar14 = optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::operator->(&window_ref);
    if (pPVar14->refname != (char *)0x0) {
      pPVar14 = optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::operator->(&window_spec);
      ::std::__cxx11::string::string((string *)&check,pPVar14->refname,(allocator *)&local_118);
      iVar15 = ::std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&root[1].args,(key_type *)&check);
      ::std::__cxx11::string::~string((string *)&check);
      if (iVar15.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_true>
          ._M_cur == (__node_type *)0x0) {
        pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&check,"window \"%s\" does not exist",(allocator *)&local_118);
        pPVar14 = optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::operator->(&window_spec);
        ParserException::ParserException<char*>(pPVar22,(string *)&check,pPVar14->refname);
        __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      window_ref.ptr =
           *(PGWindowDef **)
            ((long)iVar15.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_true>
                   ._M_cur + 0x28);
      pPVar14 = optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::operator->(&window_ref);
      if (((pPVar14->startOffset != (PGNode *)0x0) ||
          (pPVar14 = optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::operator->(&window_ref),
          pPVar14->endOffset != (PGNode *)0x0)) ||
         (pPVar14 = optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::operator->(&window_ref),
         pPVar14->frameOptions != 0x422)) {
        pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&check,"cannot copy window \"%s\" because it has a frame clause",
                   (allocator *)&local_118);
        pPVar14 = optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::operator->(&window_spec);
        ParserException::ParserException<char*>(pPVar22,(string *)&check,pPVar14->refname);
        __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    root[2].func_variadic = true;
    pPVar14 = optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::operator*(&window_ref);
    pWVar18 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
              ::operator*((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                           *)&local_160);
    TransformWindowDef((Transformer *)root,pPVar14,pWVar18,(char *)0x0);
    if (window_ref.ptr != window_spec.ptr) {
      pPVar14 = optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::operator*(&window_spec);
      pWVar18 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                ::operator*((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                             *)&local_160);
      TransformWindowDef((Transformer *)root,pPVar14,pWVar18,window_name);
    }
    pPVar14 = optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::operator*(&window_spec);
    pWVar18 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
              ::operator*((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                           *)&local_160);
    TransformWindowFrame((Transformer *)root,pPVar14,pWVar18);
    root[2].func_variadic = false;
    pWVar18 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
              ::operator*((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                           *)&local_160);
    SetQueryLocation(&pWVar18->super_ParsedExpression,*(int *)(in_RDX + 0x40));
    (this->parent).ptr = (Transformer *)local_160._M_dataplus._M_p;
    goto LAB_00a6c835;
  }
  if (*(int *)(in_RDX + 0x2c) != 0) {
    pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&check,"RESPECT/IGNORE NULLS is not supported for non-window functions",
               (allocator *)&local_160);
    ParserException::ParserException(pPVar22,(string *)&check);
    __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_160._M_dataplus._M_p = (pointer)0x0;
  if (*(long *)(in_RDX + 0x20) != 0) {
    TransformExpression((Transformer *)&check,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
    _Var7._M_p = local_160._M_dataplus._M_p;
    local_160._M_dataplus._M_p = (pointer)check.when_expr;
    check.when_expr.
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
          )0x0;
    if (((Transformer *)_Var7._M_p != (Transformer *)0x0) &&
       ((*(code *)((Transformer *)((BaseExpression *)_Var7._M_p)->_vptr_BaseExpression)->options)(),
       check.when_expr.
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0)) {
      (**(code **)(*(long *)check.when_expr.
                            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl +
                  8))();
    }
  }
  make_uniq<duckdb::OrderModifier>();
  pPVar4 = *(PGList **)(in_RDX + 0x18);
  pOVar13 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
            operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                        *)&window_spec);
  TransformOrderBy((Transformer *)root,pPVar4,&pOVar13->orders);
  if (*(char *)(in_RDX + 0x29) == '\x01') {
    pOVar13 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
              operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                          *)&window_spec);
    if ((long)(pOVar13->orders).
              super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pOVar13->orders).
              super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_start != 0x10) {
      pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&check,"Cannot use multiple ORDER BY clauses with WITHIN GROUP",
                 (allocator *)&window_ref);
      ParserException::ParserException(pPVar22,(string *)&check);
      __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar8 = ::std::operator==(&lowercase_name,"percentile_cont");
    if (bVar8) {
      if ((long)children.
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)children.
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 8) {
        pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&check,"Wrong number of arguments for PERCENTILE_CONT",
                   (allocator *)&window_ref);
        ParserException::ParserException(pPVar22,(string *)&check);
        __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      bVar8 = ::std::operator==(&lowercase_name,"percentile_disc");
      if (bVar8) {
        if ((long)children.
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)children.
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 8) {
          pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&check,"Wrong number of arguments for PERCENTILE_DISC",
                     (allocator *)&window_ref);
          ParserException::ParserException(pPVar22,(string *)&check);
          __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      else {
        bVar8 = ::std::operator==(&lowercase_name,"mode");
        if (!bVar8) {
          pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&check,"Unknown ordered aggregate \"%s\".",(allocator *)&window_ref);
          ::std::__cxx11::string::string((string *)&local_b0,(string *)&function_name);
          ParserException::ParserException<std::__cxx11::string>(pPVar22,(string *)&check,&local_b0)
          ;
          __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (children.
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            children.
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&check,"Wrong number of arguments for MODE",(allocator *)&window_ref)
          ;
          ParserException::ParserException(pPVar22,(string *)&check);
          __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
    }
    ::std::__cxx11::string::assign((char *)&lowercase_name);
  }
  bVar8 = ::std::operator==(&lowercase_name,"count");
  if ((bVar8) &&
     (children.
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      children.
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    ::std::__cxx11::string::assign((char *)&lowercase_name);
  }
  bVar8 = ::std::operator==(&lowercase_name,"if");
  if (bVar8) {
    if ((long)children.
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)children.
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x18) {
      pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&check,"Wrong number of arguments to IF.",(allocator *)&window_ref);
      ParserException::ParserException(pPVar22,(string *)&check);
      __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    make_uniq<duckdb::CaseExpression>();
    check.when_expr.
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
          )0x0;
    check.then_expr.
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
          )0x0;
    pvVar16 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::get<true>(&children,0);
    _Var3._M_head_impl =
         (pvVar16->
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pvVar16->
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t
    .super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    if (check.when_expr.
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
         )0x0) {
      lVar2 = *(long *)check.when_expr.
                       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      check.when_expr.
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           _Var3._M_head_impl;
      (**(code **)(lVar2 + 8))();
      _Var3._M_head_impl =
           (ParsedExpression *)
           check.when_expr.
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    }
    check.when_expr.
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         _Var3._M_head_impl;
    pvVar16 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::get<true>(&children,1);
    _Var3._M_head_impl =
         (pvVar16->
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pvVar16->
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t
    .super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    if (check.then_expr.
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
         )0x0) {
      lVar2 = *(long *)check.then_expr.
                       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      check.then_expr.
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           _Var3._M_head_impl;
      (**(code **)(lVar2 + 8))();
      _Var3._M_head_impl =
           (ParsedExpression *)
           check.then_expr.
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    }
    check.then_expr.
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         _Var3._M_head_impl;
    pCVar19 = unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
              ::operator->((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                            *)&window_ref);
    ::std::vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>::
    emplace_back<duckdb::CaseCheck>
              (&(pCVar19->case_checks).
                super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>,&check);
    p_Var17 = (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               *)vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                 ::get<true>(&children,2);
    pCVar19 = unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
              ::operator->((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                            *)&window_ref);
    ::std::__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ::operator=((__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 *)&pCVar19->else_expr,p_Var17);
    oVar5 = window_ref;
    window_ref.ptr = (PGWindowDef *)0x0;
    (this->parent).ptr = (Transformer *)oVar5.ptr;
    CaseCheck::~CaseCheck(&check);
    if (window_ref.ptr != (PGWindowDef *)0x0) {
      (**(code **)(*(long *)window_ref.ptr + 8))();
    }
  }
  else {
    bVar8 = ::std::operator==(&lowercase_name,"unpack");
    if (bVar8) {
      if ((long)children.
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)children.
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 8) {
        pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&check,"Wrong number of arguments to the UNPACK operator",
                   (allocator *)&window_ref);
        ParserException::ParserException(pPVar22,(string *)&check);
        __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      window_ref.ptr._0_1_ = 0x10;
      make_uniq<duckdb::OperatorExpression,duckdb::ExpressionType>
                ((duckdb *)&check,(ExpressionType *)&window_ref);
      pOVar20 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                              *)&check);
LAB_00a6c7fc:
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::_M_move_assign(&(pOVar20->children).
                        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ,&children);
    }
    else {
      bVar8 = ::std::operator==(&lowercase_name,"try");
      if (bVar8) {
        if ((long)children.
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)children.
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 8) {
          pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&check,"Wrong number of arguments provided to TRY expression",
                     (allocator *)&window_ref);
          ParserException::ParserException(pPVar22,(string *)&check);
          __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        window_ref.ptr._0_1_ = 0x9e;
        make_uniq<duckdb::OperatorExpression,duckdb::ExpressionType>
                  ((duckdb *)&check,(ExpressionType *)&window_ref);
        pOVar20 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                  ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                                *)&check);
        goto LAB_00a6c7fc;
      }
      bVar8 = ::std::operator==(&lowercase_name,"construct_array");
      if (bVar8) {
        window_ref.ptr._0_1_ = 0x9c;
        make_uniq<duckdb::OperatorExpression,duckdb::ExpressionType>
                  ((duckdb *)&check,(ExpressionType *)&window_ref);
        pOVar20 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                  ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                                *)&check);
        goto LAB_00a6c7fc;
      }
      bVar8 = ::std::operator==(&lowercase_name,"__internal_position_operator");
      if (bVar8) {
        if ((long)children.
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)children.
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0x10) {
          pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&check,"Wrong number of arguments to __internal_position_operator.",
                     (allocator *)&window_ref);
          ParserException::ParserException(pPVar22,(string *)&check);
          __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pvVar16 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::get<true>(&children,0);
        __b = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::get<true>(&children,1);
        ::std::
        swap<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  (pvVar16,__b);
        ::std::__cxx11::string::assign((char *)&lowercase_name);
LAB_00a6c8f3:
        window_ref.ptr = (PGWindowDef *)lowercase_name._M_dataplus._M_p;
        _win_fun_type = _win_fun_type & 0xffffffffffffff00;
        make_uniq<duckdb::FunctionExpression,std::__cxx11::string,std::__cxx11::string,char_const*,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::unique_ptr<duckdb::OrderModifier,std::default_delete<duckdb::OrderModifier>,true>,bool&,bool,bool&>
                  ((duckdb *)&check,&catalog,&schema,(char **)&window_ref,&children,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_160,
                   (unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                    *)&window_spec,(bool *)(in_RDX + 0x2b),(bool *)&win_fun_type,
                   (bool *)(in_RDX + 0x28));
        expr = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
               ::operator*((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                            *)&check);
        SetQueryLocation(&expr->super_ParsedExpression,*(int *)(in_RDX + 0x40));
      }
      else {
        bVar8 = ::std::operator==(&lowercase_name,"ifnull");
        if (!bVar8) {
          bVar8 = ::std::operator==(&lowercase_name,"list");
          if ((bVar8) &&
             (pOVar13 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                        ::operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                                      *)&window_spec),
             (long)(pOVar13->orders).
                   super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                   super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pOVar13->orders).
                   super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                   super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                   _M_impl.super__Vector_impl_data._M_start == 0x10)) {
            if ((long)children.
                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)children.
                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != 8) {
              pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&check,"Wrong number of arguments to LIST.",
                         (allocator *)&window_ref);
              ParserException::ParserException(pPVar22,(string *)&check);
              __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
            }
            pvVar16 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                      ::get<true>(&children,0);
            _Var3._M_head_impl =
                 (pvVar16->
                 super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
            pOVar13 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                      ::operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                                    *)&window_spec);
            pvVar21 = vector<duckdb::OrderByNode,_true>::get<true>(&pOVar13->orders,0);
            pPVar11 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator*(&pvVar21->expression);
            cVar10 = (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 0x50))
                               (_Var3._M_head_impl,pPVar11);
            if (cVar10 != '\0') {
              window_ref.ptr = (PGWindowDef *)EnumUtil::ToChars<duckdb::OrderType>(pvVar21->type);
              make_uniq<duckdb::ConstantExpression,char_const*>
                        ((duckdb *)&check,(char **)&window_ref);
              _win_fun_type =
                   (FunctionExpression *)
                   EnumUtil::ToChars<duckdb::OrderByNullType>(pvVar21->null_order);
              make_uniq<duckdb::ConstantExpression,char_const*>
                        ((duckdb *)&window_ref,(char **)&win_fun_type);
              oVar5 = window_spec;
              window_spec.ptr = (PGWindowDef *)0x0;
              if (oVar5.ptr != (PGWindowDef *)0x0) {
                (**(code **)(*(long *)oVar5.ptr + 8))();
              }
              local_118 = (pointer)lowercase_name._M_dataplus._M_p;
              local_139 = false;
              make_uniq<duckdb::FunctionExpression,std::__cxx11::string&,std::__cxx11::string&,char_const*,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::unique_ptr<duckdb::OrderModifier,std::default_delete<duckdb::OrderModifier>,true>,bool&,bool,bool&>
                        ((duckdb *)&win_fun_type,&catalog,&schema,(char **)&local_118,&children,
                         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                          *)&local_160,
                         (unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                          *)&window_spec,(bool *)(in_RDX + 0x2b),&local_139,(bool *)(in_RDX + 0x28))
              ;
              ::std::__cxx11::string::assign((char *)&lowercase_name);
              oVar5 = window_spec;
              window_spec.ptr = (PGWindowDef *)0x0;
              if (oVar5.ptr != (PGWindowDef *)0x0) {
                (**(code **)(*(long *)oVar5.ptr + 8))();
              }
              _Var7._M_p = local_160._M_dataplus._M_p;
              local_160._M_dataplus._M_p = (pointer)0x0;
              if ((Transformer *)_Var7._M_p != (Transformer *)0x0) {
                (**(code **)(*(long *)_Var7._M_p + 8))();
              }
              ::std::
              vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ::clear((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       *)&children);
              *(bool *)(in_RDX + 0x2b) = false;
              ::std::
              vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::FunctionExpression,std::default_delete<duckdb::FunctionExpression>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                          *)&children,
                         (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                          *)&win_fun_type);
              ::std::
              vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::ConstantExpression,std::default_delete<duckdb::ConstantExpression>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                          *)&children,
                         (unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                          *)&check);
              ::std::
              vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::ConstantExpression,std::default_delete<duckdb::ConstantExpression>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                          *)&children,
                         (unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                          *)&window_ref);
              if (_win_fun_type != (FunctionExpression *)0x0) {
                (**(code **)(*(long *)_win_fun_type + 8))();
              }
              if (window_ref.ptr != (PGWindowDef *)0x0) {
                (**(code **)(*(long *)window_ref.ptr + 8))();
              }
              if (check.when_expr.
                  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
                  (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
                   )0x0) {
                (**(code **)(*(long *)check.when_expr.
                                      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                      ._M_t.
                                      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                      _M_head_impl + 8))();
              }
            }
          }
          else {
            bVar8 = ::std::operator==(&lowercase_name,"date");
            if (bVar8) {
              if ((long)children.
                        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)children.
                        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != 8) {
                pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
                ::std::__cxx11::string::string
                          ((string *)&check,"Wrong number of arguments provided to DATE function",
                           (allocator *)&window_ref);
                ParserException::ParserException(pPVar22,(string *)&check);
                __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
              pvVar16 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                        ::get<true>(&children,0);
              make_uniq<duckdb::CastExpression,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                        ((duckdb *)&check,&LogicalType::DATE,pvVar16);
              goto LAB_00a6c80d;
            }
          }
          goto LAB_00a6c8f3;
        }
        if ((long)children.
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)children.
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0x10) {
          pPVar22 = (ParserException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&check,"Wrong number of arguments to IFNULL.",
                     (allocator *)&window_ref);
          ParserException::ParserException(pPVar22,(string *)&check);
          __cxa_throw(pPVar22,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        window_ref.ptr._0_1_ = 0x98;
        make_uniq<duckdb::OperatorExpression,duckdb::ExpressionType>
                  ((duckdb *)&check,(ExpressionType *)&window_ref);
        pOVar20 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                  ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                                *)&check);
        pvVar16 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::get<true>(&children,0);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&pOVar20->children,pvVar16);
        pOVar20 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                  ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                                *)&check);
        pvVar16 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::get<true>(&children,1);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&pOVar20->children,pvVar16);
      }
    }
LAB_00a6c80d:
    (this->parent).ptr =
         (Transformer *)
         check.when_expr.
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  }
  if (window_spec.ptr != (PGWindowDef *)0x0) {
    (**(code **)(*(long *)window_spec.ptr + 8))();
  }
  if ((Transformer *)local_160._M_dataplus._M_p != (Transformer *)0x0) {
    (**(code **)(*(long *)local_160._M_dataplus._M_p + 8))();
  }
LAB_00a6c835:
  ::std::__cxx11::string::~string((string *)&lowercase_name);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&children.
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           );
  ::std::__cxx11::string::~string((string *)&function_name);
  ::std::__cxx11::string::~string((string *)&schema);
  ::std::__cxx11::string::~string((string *)&catalog);
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformFuncCall(duckdb_libpgquery::PGFuncCall &root) {
	auto name = root.funcname;
	string catalog, schema, function_name;
	if (name->length == 3) {
		// catalog + schema + name
		catalog = PGPointerCast<duckdb_libpgquery::PGValue>(name->head->data.ptr_value)->val.str;
		schema = PGPointerCast<duckdb_libpgquery::PGValue>(name->head->next->data.ptr_value)->val.str;
		function_name = PGPointerCast<duckdb_libpgquery::PGValue>(name->head->next->next->data.ptr_value)->val.str;
	} else if (name->length == 2) {
		// schema + name
		catalog = INVALID_CATALOG;
		schema = PGPointerCast<duckdb_libpgquery::PGValue>(name->head->data.ptr_value)->val.str;
		function_name = PGPointerCast<duckdb_libpgquery::PGValue>(name->head->next->data.ptr_value)->val.str;
	} else if (name->length == 1) {
		// unqualified name
		catalog = INVALID_CATALOG;
		schema = INVALID_SCHEMA;
		function_name = PGPointerCast<duckdb_libpgquery::PGValue>(name->head->data.ptr_value)->val.str;
	} else {
		throw ParserException("TransformFuncCall - Expected 1, 2 or 3 qualifications");
	}

	//  transform children
	vector<unique_ptr<ParsedExpression>> children;
	if (root.args) {
		TransformExpressionList(*root.args, children);
	}
	if (children.size() == 1 && ExpressionIsEmptyStar(*children[0]) && !root.agg_distinct && !root.agg_order) {
		// COUNT(*) gets translated into COUNT()
		children.clear();
	}

	auto lowercase_name = StringUtil::Lower(function_name);
	if (root.over) {
		if (InWindowDefinition()) {
			throw ParserException("window functions are not allowed in window definitions");
		}

		const auto win_fun_type = WindowExpression::WindowToExpressionType(lowercase_name);
		if (win_fun_type == ExpressionType::INVALID) {
			throw InternalException("Unknown/unsupported window function");
		}

		if (win_fun_type != ExpressionType::WINDOW_AGGREGATE && root.agg_distinct) {
			throw ParserException("DISTINCT is not implemented for non-aggregate window functions!");
		}

		if (root.agg_order && !IsOrderableWindowFunction(win_fun_type)) {
			throw ParserException("ORDER BY is not supported for the window function \"%s\"", lowercase_name.c_str());
		}

		if (win_fun_type != ExpressionType::WINDOW_AGGREGATE && root.agg_filter) {
			throw ParserException("FILTER is not implemented for non-aggregate window functions!");
		}
		if (root.export_state) {
			throw ParserException("EXPORT_STATE is not supported for window functions!");
		}

		if (win_fun_type == ExpressionType::WINDOW_AGGREGATE &&
		    root.agg_ignore_nulls != duckdb_libpgquery::PG_DEFAULT_NULLS) {
			throw ParserException("RESPECT/IGNORE NULLS is not supported for windowed aggregates");
		}

		auto expr = make_uniq<WindowExpression>(win_fun_type, std::move(catalog), std::move(schema), lowercase_name);
		expr->ignore_nulls = (root.agg_ignore_nulls == duckdb_libpgquery::PG_IGNORE_NULLS);
		expr->distinct = root.agg_distinct;

		if (root.agg_filter) {
			auto filter_expr = TransformExpression(root.agg_filter);
			expr->filter_expr = std::move(filter_expr);
		}

		if (root.agg_order) {
			auto order_bys = make_uniq<OrderModifier>();
			TransformOrderBy(root.agg_order, order_bys->orders);
			expr->arg_orders = std::move(order_bys->orders);
		}

		if (win_fun_type == ExpressionType::WINDOW_AGGREGATE) {
			expr->children = std::move(children);
		} else {
			if (!children.empty()) {
				expr->children.push_back(std::move(children[0]));
			}
			if (win_fun_type == ExpressionType::WINDOW_LEAD || win_fun_type == ExpressionType::WINDOW_LAG) {
				if (children.size() > 1) {
					expr->offset_expr = std::move(children[1]);
				}
				if (children.size() > 2) {
					expr->default_expr = std::move(children[2]);
				}
				if (children.size() > 3) {
					throw ParserException("Incorrect number of parameters for function %s", lowercase_name);
				}
			} else if (win_fun_type == ExpressionType::WINDOW_NTH_VALUE) {
				if (children.size() > 1) {
					expr->children.push_back(std::move(children[1]));
				}
				if (children.size() > 2) {
					throw ParserException("Incorrect number of parameters for function %s", lowercase_name);
				}
			} else {
				if (children.size() > 1) {
					throw ParserException("Incorrect number of parameters for function %s", lowercase_name);
				}
			}
		}
		auto window_spec = PGPointerCast<duckdb_libpgquery::PGWindowDef>(root.over);
		if (window_spec->name) {
			auto it = window_clauses.find(string(window_spec->name));
			if (it == window_clauses.end()) {
				throw ParserException("window \"%s\" does not exist", window_spec->name);
			}
			window_spec = it->second;
			D_ASSERT(window_spec);
		}
		auto window_ref = window_spec;
		auto window_name = window_ref->refname;
		if (window_ref->refname) {
			auto it = window_clauses.find(string(window_spec->refname));
			if (it == window_clauses.end()) {
				throw ParserException("window \"%s\" does not exist", window_spec->refname);
			}
			window_ref = it->second;
			D_ASSERT(window_ref);
			if (window_ref->startOffset || window_ref->endOffset || window_ref->frameOptions != FRAMEOPTION_DEFAULTS) {
				throw ParserException("cannot copy window \"%s\" because it has a frame clause", window_spec->refname);
			}
		}
		in_window_definition = true;
		TransformWindowDef(*window_ref, *expr);
		if (window_ref != window_spec) {
			TransformWindowDef(*window_spec, *expr, window_name);
		}
		TransformWindowFrame(*window_spec, *expr);
		in_window_definition = false;
		SetQueryLocation(*expr, root.location);
		return std::move(expr);
	}

	if (root.agg_ignore_nulls != duckdb_libpgquery::PG_DEFAULT_NULLS) {
		throw ParserException("RESPECT/IGNORE NULLS is not supported for non-window functions");
	}

	unique_ptr<ParsedExpression> filter_expr;
	if (root.agg_filter) {
		filter_expr = TransformExpression(root.agg_filter);
	}

	auto order_bys = make_uniq<OrderModifier>();
	TransformOrderBy(root.agg_order, order_bys->orders);

	// Ordered aggregates can be either WITHIN GROUP or after the function arguments
	if (root.agg_within_group) {
		//	https://www.postgresql.org/docs/current/functions-aggregate.html#FUNCTIONS-ORDEREDSET-TABLE
		//  Since we implement "ordered aggregates" without sorting,
		//  we map all the ones we support to the corresponding aggregate function.
		if (order_bys->orders.size() != 1) {
			throw ParserException("Cannot use multiple ORDER BY clauses with WITHIN GROUP");
		}
		if (lowercase_name == "percentile_cont") {
			if (children.size() != 1) {
				throw ParserException("Wrong number of arguments for PERCENTILE_CONT");
			}
			lowercase_name = "quantile_cont";
		} else if (lowercase_name == "percentile_disc") {
			if (children.size() != 1) {
				throw ParserException("Wrong number of arguments for PERCENTILE_DISC");
			}
			lowercase_name = "quantile_disc";
		} else if (lowercase_name == "mode") {
			if (!children.empty()) {
				throw ParserException("Wrong number of arguments for MODE");
			}
			lowercase_name = "mode";
		} else {
			throw ParserException("Unknown ordered aggregate \"%s\".", function_name);
		}
	}

	// star gets eaten in the parser
	if (lowercase_name == "count" && children.empty()) {
		lowercase_name = "count_star";
	}

	if (lowercase_name == "if") {
		if (children.size() != 3) {
			throw ParserException("Wrong number of arguments to IF.");
		}
		auto expr = make_uniq<CaseExpression>();
		CaseCheck check;
		check.when_expr = std::move(children[0]);
		check.then_expr = std::move(children[1]);
		expr->case_checks.push_back(std::move(check));
		expr->else_expr = std::move(children[2]);
		return std::move(expr);
	} else if (lowercase_name == "unpack") {
		if (children.size() != 1) {
			throw ParserException("Wrong number of arguments to the UNPACK operator");
		}
		auto expr = make_uniq<OperatorExpression>(ExpressionType::OPERATOR_UNPACK);
		expr->children = std::move(children);
		return std::move(expr);
	} else if (lowercase_name == "try") {
		if (children.size() != 1) {
			throw ParserException("Wrong number of arguments provided to TRY expression");
		}
		auto try_expression = make_uniq<OperatorExpression>(ExpressionType::OPERATOR_TRY);
		try_expression->children = std::move(children);
		return std::move(try_expression);
	} else if (lowercase_name == "construct_array") {
		auto construct_array = make_uniq<OperatorExpression>(ExpressionType::ARRAY_CONSTRUCTOR);
		construct_array->children = std::move(children);
		return std::move(construct_array);
	} else if (lowercase_name == "__internal_position_operator") {
		if (children.size() != 2) {
			throw ParserException("Wrong number of arguments to __internal_position_operator.");
		}
		// swap arguments for POSITION(x IN y)
		std::swap(children[0], children[1]);
		lowercase_name = "position";
	} else if (lowercase_name == "ifnull") {
		if (children.size() != 2) {
			throw ParserException("Wrong number of arguments to IFNULL.");
		}

		//  Two-argument COALESCE
		auto coalesce_op = make_uniq<OperatorExpression>(ExpressionType::OPERATOR_COALESCE);
		coalesce_op->children.push_back(std::move(children[0]));
		coalesce_op->children.push_back(std::move(children[1]));
		return std::move(coalesce_op);
	} else if (lowercase_name == "list" && order_bys->orders.size() == 1) {
		// list(expr ORDER BY expr <sense> <nulls>) => list_sort(list(expr), <sense>, <nulls>)
		if (children.size() != 1) {
			throw ParserException("Wrong number of arguments to LIST.");
		}
		auto arg_expr = children[0].get();
		auto &order_by = order_bys->orders[0];
		if (arg_expr->Equals(*order_by.expression)) {
			auto sense = make_uniq<ConstantExpression>(EnumUtil::ToChars(order_by.type));
			auto nulls = make_uniq<ConstantExpression>(EnumUtil::ToChars(order_by.null_order));
			order_bys = nullptr;
			auto unordered = make_uniq<FunctionExpression>(catalog, schema, lowercase_name.c_str(), std::move(children),
			                                               std::move(filter_expr), std::move(order_bys),
			                                               root.agg_distinct, false, root.export_state);
			lowercase_name = "list_sort";
			order_bys.reset();   // NOLINT
			filter_expr.reset(); // NOLINT
			children.clear();    // NOLINT
			root.agg_distinct = false;
			children.emplace_back(std::move(unordered));
			children.emplace_back(std::move(sense));
			children.emplace_back(std::move(nulls));
		}
	} else if (lowercase_name == "date") {
		if (children.size() != 1) {
			throw ParserException("Wrong number of arguments provided to DATE function");
		}
		return std::move(make_uniq<CastExpression>(LogicalType::DATE, std::move(children[0])));
	}

	auto function = make_uniq<FunctionExpression>(std::move(catalog), std::move(schema), lowercase_name.c_str(),
	                                              std::move(children), std::move(filter_expr), std::move(order_bys),
	                                              root.agg_distinct, false, root.export_state);
	SetQueryLocation(*function, root.location);

	return std::move(function);
}